

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O2

Vec_Int_t * Lpk_ComputeBoundSets(Kit_DsdNtk_t *p,int nSizeMax)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  long lVar5;
  
  if (0x10 < p->nVars) {
    __assert_fail("p->nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDsd.c"
                  ,0xa7,"Vec_Int_t *Lpk_ComputeBoundSets(Kit_DsdNtk_t *, int)");
  }
  p_00 = Vec_IntAlloc((int)p);
  Vec_IntPush(p_00,0);
  pKVar3 = Kit_DsdNtkRoot(p);
  if (((uint)*pKVar3 & 0x1c0) != 0x40) {
    pKVar3 = Kit_DsdNtkRoot(p);
    if (((uint)*pKVar3 & 0x1c0) == 0x80) {
      pKVar3 = Kit_DsdNtkRoot(p);
      iVar1 = Abc_Lit2Var((uint)*(ushort *)(pKVar3 + 1));
      uVar4 = 1 << ((byte)iVar1 & 0x1f);
      iVar1 = Kit_WordCountOnes(uVar4);
      if (iVar1 <= nSizeMax) {
        Vec_IntPush(p_00,uVar4);
      }
    }
    else {
      uVar4 = Lpk_ComputeBoundSets_rec(p,(uint)p->Root,p_00,nSizeMax);
      if (0xffff < uVar4) {
        __assert_fail("(uSupport & 0xFFFF0000) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/lpk/lpkAbcDsd.c"
                      ,0xb4,"Vec_Int_t *Lpk_ComputeBoundSets(Kit_DsdNtk_t *, int)");
      }
      iVar1 = Kit_WordCountOnes(uVar4);
      if (iVar1 <= nSizeMax) {
        Vec_IntPush(p_00,uVar4);
      }
      for (lVar5 = 0; lVar5 < p_00->nSize; lVar5 = lVar5 + 1) {
        uVar2 = Vec_IntEntry(p_00,(int)lVar5);
        if (p_00->nSize <= lVar5) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p_00->pArray[lVar5] = (~uVar2 & uVar4) << 0x10 | uVar2;
      }
    }
  }
  return p_00;
}

Assistant:

Vec_Int_t * Lpk_ComputeBoundSets( Kit_DsdNtk_t * p, int nSizeMax )
{
    Vec_Int_t * vSets;
    unsigned uSupport, Entry;
    int Number, i;
    assert( p->nVars <= 16 );
    vSets = Vec_IntAlloc( 100 );
    Vec_IntPush( vSets, 0 );
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_CONST1 )
        return vSets;
    if ( Kit_DsdNtkRoot(p)->Type == KIT_DSD_VAR )
    {
        uSupport = ( 1 << Abc_Lit2Var(Kit_DsdNtkRoot(p)->pFans[0]) );
        if ( Kit_WordCountOnes(uSupport) <= nSizeMax )
            Vec_IntPush( vSets, uSupport );
        return vSets;
    }
    uSupport = Lpk_ComputeBoundSets_rec( p, p->Root, vSets, nSizeMax );
    assert( (uSupport & 0xFFFF0000) == 0 );
    // add the total support of the network
    if ( Kit_WordCountOnes(uSupport) <= nSizeMax )
        Vec_IntPush( vSets, uSupport );
    // set the remaining variables
    Vec_IntForEachEntry( vSets, Number, i )
    {
        Entry = Number;
        Vec_IntWriteEntry( vSets, i, Entry | ((uSupport & ~Entry) << 16) );
    }
    return vSets;
}